

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspFacade::~ClaspFacade(ClaspFacade *this)

{
  (this->super_ModelHandler)._vptr_ModelHandler = (_func_int **)&PTR__ClaspFacade_001e72f8;
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->solve_)
  ;
  SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject>::~SingleOwnerPtr
            (&this->stats_);
  SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->accu_);
  SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->builder_);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo
            (&(this->assume_).ebo_);
  SharedContext::~SharedContext(&this->ctx);
  ModelHandler::~ModelHandler(&this->super_ModelHandler);
  return;
}

Assistant:

ClaspFacade::~ClaspFacade() {}